

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

void __thiscall
mapbox::detail::Earcut<unsigned_int>::splitEarcut(Earcut<unsigned_int> *this,Node *start)

{
  bool bVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar3 = start;
  do {
    pNVar2 = pNVar3->next;
    while (pNVar2 = pNVar2->next, pNVar2 != pNVar3->prev) {
      if (pNVar3->i != pNVar2->i) {
        bVar1 = isValidDiagonal(this,pNVar3,pNVar2);
        if (bVar1) {
          pNVar2 = splitPolygon(this,pNVar3,pNVar2);
          pNVar3 = filterPoints(this,pNVar3,pNVar3->next);
          pNVar2 = filterPoints(this,pNVar2,pNVar2->next);
          earcutLinked(this,pNVar3,0);
          earcutLinked(this,pNVar2,0);
          return;
        }
      }
    }
    pNVar3 = pNVar3->next;
    if (pNVar3 == start) {
      return;
    }
  } while( true );
}

Assistant:

void Earcut<N>::splitEarcut(Node* start) {
    // look for a valid diagonal that divides the polygon into two
    Node* a = start;
    do {
        Node* b = a->next->next;
        while (b != a->prev) {
            if (a->i != b->i && isValidDiagonal(a, b)) {
                // split the polygon in two by the diagonal
                Node* c = splitPolygon(a, b);

                // filter colinear points around the cuts
                a = filterPoints(a, a->next);
                c = filterPoints(c, c->next);

                // run earcut on each half
                earcutLinked(a);
                earcutLinked(c);
                return;
            }
            b = b->next;
        }
        a = a->next;
    } while (a != start);
}